

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O0

EnvNAVXYTHETALATHashEntry_t * __thiscall
EnvironmentNAVXYTHETALAT::CreateNewHashEntry_hash
          (EnvironmentNAVXYTHETALAT *this,int X,int Y,int Theta)

{
  EnvNAVXYTHETALATHashEntry_t *pEVar1;
  size_type sVar2;
  reference ppiVar3;
  SBPL_Exception *this_00;
  char in_CL;
  int in_EDX;
  int in_ESI;
  vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_> *in_RDI;
  int *entry;
  EnvNAVXYTHETALATHashEntry_t *HashEntry;
  int i;
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar4;
  int local_18;
  
  pEVar1 = (EnvNAVXYTHETALATHashEntry_t *)operator_new(0x14);
  pEVar1->X = in_ESI;
  pEVar1->Y = in_EDX;
  pEVar1->Theta = in_CL;
  pEVar1->iteration = 0;
  sVar2 = std::vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
          ::size((vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                  *)&in_RDI[0x11].
                     super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  pEVar1->stateID = (int)sVar2;
  std::vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>::
  push_back(in_RDI,(value_type *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  (*(code *)(in_RDI->
            super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
            )._M_impl.super__Vector_impl_data._M_start[0x59])
            (in_RDI,pEVar1->X,pEVar1->Y,(int)pEVar1->Theta);
  std::vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>::
  push_back(in_RDI,(value_type *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  operator_new__(8);
  std::vector<int_*,_std::allocator<int_*>_>::push_back
            ((vector<int_*,_std::allocator<int_*>_> *)in_RDI,
             (value_type *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
    ppiVar3 = std::vector<int_*,_std::allocator<int_*>_>::operator[]
                        ((vector<int_*,_std::allocator<int_*>_> *)
                         &(in_RDI->
                          super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish,(long)pEVar1->stateID);
    (*ppiVar3)[local_18] = -1;
  }
  iVar4 = pEVar1->stateID;
  sVar2 = std::vector<int_*,_std::allocator<int_*>_>::size
                    ((vector<int_*,_std::allocator<int_*>_> *)
                     &(in_RDI->
                      super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish);
  if (iVar4 != (int)sVar2 + -1) {
    this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(this_00,in_stack_ffffffffffffffa8);
    __cxa_throw(this_00,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  return pEVar1;
}

Assistant:

EnvNAVXYTHETALATHashEntry_t*
EnvironmentNAVXYTHETALAT::CreateNewHashEntry_hash(int X, int Y, int Theta)
{
    int i;

#if TIME_DEBUG
    clock_t currenttime = clock();
#endif

    EnvNAVXYTHETALATHashEntry_t* HashEntry = new EnvNAVXYTHETALATHashEntry_t;

    HashEntry->X = X;
    HashEntry->Y = Y;
    HashEntry->Theta = Theta;
    HashEntry->iteration = 0;

    HashEntry->stateID = StateID2CoordTable.size();

    // insert into the tables
    StateID2CoordTable.push_back(HashEntry);

    // get the hash table bin
    i = GETHASHBIN(HashEntry->X, HashEntry->Y, HashEntry->Theta);

    // insert the entry into the bin
    Coord2StateIDHashTable[i].push_back(HashEntry);

    // insert into and initialize the mappings
    int* entry = new int[NUMOFINDICES_STATEID2IND];
    StateID2IndexMapping.push_back(entry);
    for (i = 0; i < NUMOFINDICES_STATEID2IND; i++) {
        StateID2IndexMapping[HashEntry->stateID][i] = -1;
    }

    if (HashEntry->stateID != (int)StateID2IndexMapping.size() - 1) {
        throw SBPL_Exception("ERROR in Env... function: last state has incorrect stateID");
    }

#if TIME_DEBUG
    time_createhash += clock() - currenttime;
#endif

    return HashEntry;
}